

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YSet.cpp
# Opt level: O0

YError __thiscall
Yedis::YSet::sadd(YSet *this,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *params,ReplyBuffer *reply)

{
  const_reference pvVar1;
  YObject *this_00;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  size_type sVar2;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar3;
  ulong local_48;
  size_t i;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *set;
  int res;
  YObject *value;
  ReplyBuffer *reply_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *params_local;
  YSet *this_local;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](params,1);
  this_00 = creatrOrGetSet(this,pvVar1,reply);
  if (this_00 == (YObject *)0x0) {
    ReplyBuffer::pushData(reply,"-ERR error type\r\n",0xf);
    this_local._4_4_ = YError_type;
  }
  else {
    set._4_4_ = 0;
    this_01 = YObject::castSet_abi_cxx11_(this_00);
    local_48 = 2;
    while( true ) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(params);
      if (sVar2 <= local_48) break;
      pvVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](params,local_48);
      pVar3 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(this_01,pvVar1);
      if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        set._4_4_ = set._4_4_ + 1;
      }
      local_48 = local_48 + 1;
    }
    YedisFormate::formatInt((long)set._4_4_,reply);
    this_local._4_4_ = YError_ok;
  }
  return this_local._4_4_;
}

Assistant:

YError YSet::sadd(const std::vector<std::string>& params, ReplyBuffer* reply)
{
    YObject* value = creatrOrGetSet(params[1], reply);
    if(value == nullptr)
    {
        reply->pushData("-ERR error type\r\n", sizeof("-ERR error type") -1);
        return YError_type;
    }
    int res = 0;
    auto set = value->castSet();
    for (std::size_t i = 2; i < params.size(); ++ i)
    {
        if (set->insert(params[i]).second)
        {
            ++res;
        }
    }
    
    Yedis::YedisFormate::formatInt(res, reply);
    return YError_ok;
}